

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadThreadsGraph.cc
# Opt level: O1

bool __thiscall
ReadThreadsGraph::add_thread
          (ReadThreadsGraph *this,int64_t thread_id,
          vector<NodePosition,_std::allocator<NodePosition>_> *node_positions,bool remove_duplicated
          ,int min_thread_nodes)

{
  _Hash_node_base *p_Var1;
  pointer pNVar2;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var3;
  __node_base _Var4;
  ReadThreadsGraph *this_00;
  size_type sVar5;
  pointer pNVar6;
  mapped_type *pmVar7;
  undefined7 in_register_00000009;
  long lVar8;
  uint16_t uVar9;
  NodePosition *p;
  vector<NodePosition,_std::allocator<NodePosition>_> *__range2;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  Support support;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> duplicated;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_d0;
  long local_c8;
  undefined4 local_bc;
  ReadThreadsGraph *local_b8;
  int64_t local_b0;
  sgNodeID_t local_a8;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_b0 = thread_id;
  if ((ulong)((long)(node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)(long)min_thread_nodes
     ) {
    bVar12 = false;
  }
  else {
    local_bc = (undefined4)CONCAT71(in_register_00000009,remove_duplicated);
    local_b8 = this;
    if (remove_duplicated) {
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_element_count = 0;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_bucket_count = 1;
      local_a0._M_single_bucket = (__node_base_ptr)0x0;
      local_a0._M_rehash_policy._M_next_resize = 0;
      local_a0._M_rehash_policy._M_max_load_factor = 1.0;
      local_a0._M_element_count = 0;
      local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a0._M_bucket_count = 1;
      memset(local_68._M_buckets,0,8);
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      _Var4._M_nxt = local_a0._M_before_begin._M_nxt;
      while (_Var4._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = (_Var4._M_nxt)->_M_nxt;
        operator_delete(_Var4._M_nxt,0x10);
        _Var4._M_nxt = p_Var1;
      }
      memset(local_a0._M_buckets,0,local_a0._M_bucket_count << 3);
      local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a0._M_element_count = 0;
      pNVar6 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pNVar2 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pNVar6 != pNVar2) {
        do {
          p_Var3 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)pNVar6->node;
          local_d0 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)-(long)p_Var3;
          if (0 < (long)p_Var3) {
            local_d0 = p_Var3;
          }
          sVar5 = std::
                  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&local_68,(key_type *)&local_d0);
          if (sVar5 == 0) {
            lVar8 = pNVar6->node;
            local_c8 = -lVar8;
            if (0 < lVar8) {
              local_c8 = lVar8;
            }
            local_d0 = &local_68;
            std::
            _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                      ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,&local_c8,&local_d0);
          }
          else {
            lVar8 = pNVar6->node;
            local_c8 = -lVar8;
            if (0 < lVar8) {
              local_c8 = lVar8;
            }
            local_d0 = &local_a0;
            std::
            _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                      ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_a0,&local_c8,&local_d0);
          }
          pNVar6 = pNVar6 + 1;
        } while (pNVar6 != pNVar2);
      }
    }
    this_00 = local_b8;
    pNVar6 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
        super__Vector_impl_data._M_finish == pNVar6) {
      iVar10 = -1;
      uVar9 = 0;
    }
    else {
      iVar10 = -1;
      lVar8 = 0;
      uVar11 = 0;
      uVar9 = 0;
      do {
        if ((char)local_bc == '\0') {
LAB_002050f3:
          if (iVar10 == -1) {
            local_a8 = *(sgNodeID_t *)
                        ((long)&((node_positions->
                                 super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->node + lVar8);
          }
          else {
            pNVar6 = (node_positions->
                     super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            support._0_8_ = (ulong)uVar9 << 0x10 | 7;
            support.id = local_b0;
            DistanceGraph::add_link
                      (&this_00->super_DistanceGraph,-pNVar6[iVar10].node,
                       *(sgNodeID_t *)((long)&pNVar6->node + lVar8),
                       *(int *)((long)&pNVar6->start + lVar8) - pNVar6[iVar10].end,support);
            uVar9 = uVar9 + 1;
          }
          iVar10 = (int)uVar11;
        }
        else {
          p_Var3 = *(_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     **)((long)&pNVar6->node + lVar8);
          local_d0 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)-(long)p_Var3;
          if (0 < (long)p_Var3) {
            local_d0 = p_Var3;
          }
          sVar5 = std::
                  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&local_a0,(key_type *)&local_d0);
          if (sVar5 == 0) goto LAB_002050f3;
        }
        uVar11 = uVar11 + 1;
        pNVar6 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x10;
      } while (uVar11 < (ulong)((long)(node_positions->
                                      super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar6 >>
                               4));
    }
    bVar12 = iVar10 != -1;
    if (bVar12) {
      lVar8 = pNVar6[iVar10].node;
      pmVar7 = std::__detail::
               _Map_base<long,_std::pair<const_long,_ThreadInfo>,_std::allocator<std::pair<const_long,_ThreadInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_ThreadInfo>,_std::allocator<std::pair<const_long,_ThreadInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this_00->thread_info,&local_b0);
      pmVar7->start = local_a8;
      pmVar7->end = -lVar8;
      pmVar7->link_count = uVar9;
      bVar12 = true;
    }
  }
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return bVar12;
}

Assistant:

bool ReadThreadsGraph::add_thread(int64_t thread_id, const std::vector<NodePosition> &node_positions, bool remove_duplicated, int min_thread_nodes) {
    std::unordered_set<sgNodeID_t> seen,duplicated;
    if (node_positions.size()<min_thread_nodes) return false;
    if (remove_duplicated) {
        seen.clear();
        duplicated.clear();
        for (const auto &p:node_positions){
            if (seen.count(llabs(p.node))) duplicated.insert(llabs(p.node));
            else seen.insert(llabs(p.node));
        }
    }
    uint16_t lidx=0;
    int32_t last_valid_i=-1;
    sgNodeID_t end1;
    for (int32_t i = 0; i < node_positions.size(); ++i) {
        if (remove_duplicated and  duplicated.count(llabs(node_positions[i].node))) continue;
        if (last_valid_i!=-1) {
            add_link(-node_positions[last_valid_i].node, node_positions[i].node,
                     node_positions[i].start - node_positions[last_valid_i].end,
                     {SupportType::LongRead, lidx++, thread_id});
        }
        else end1=node_positions[i].node;
        last_valid_i=i;
    }
    if (last_valid_i==-1) return false;
    sgNodeID_t end2=-node_positions[last_valid_i].node;
    thread_info[thread_id]={end1, end2, lidx};
    return true;
}